

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O0

void hts_idx_set_meta(hts_idx_t *idx,int l_meta,uint8_t *meta,int is_copy)

{
  uint8_t *puVar1;
  int is_copy_local;
  uint8_t *meta_local;
  int l_meta_local;
  hts_idx_t *idx_local;
  
  if (idx->meta != (uint8_t *)0x0) {
    free(idx->meta);
  }
  idx->l_meta = l_meta;
  if (is_copy == 0) {
    idx->meta = meta;
  }
  else {
    puVar1 = (uint8_t *)malloc((long)l_meta);
    idx->meta = puVar1;
    memcpy(idx->meta,meta,(long)l_meta);
  }
  return;
}

Assistant:

void hts_idx_set_meta(hts_idx_t *idx, int l_meta, uint8_t *meta, int is_copy)
{
    if (idx->meta) free(idx->meta);
    idx->l_meta = l_meta;
    if (is_copy) {
        idx->meta = (uint8_t*)malloc(l_meta);
        memcpy(idx->meta, meta, l_meta);
    } else idx->meta = meta;
}